

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O3

void * mpp_dec_hal_thread(void *data)

{
  int iVar1;
  RK_S32 index_00;
  MppDec ctx;
  MppDec ctx_00;
  MppBufSlots slots;
  MppThreadStatus MVar2;
  MPP_RET MVar3;
  pthread_mutex_t *__mutex;
  undefined4 index_01;
  HalTaskGroup pvVar4;
  MppThread *this;
  long lVar5;
  HalTaskHnd task;
  RK_S32 index;
  HalTaskInfo task_info;
  HalTaskHnd local_100;
  RK_S32 local_f4;
  HalTaskHnd local_f0;
  HalTaskGroup local_e8;
  MppBufSlots local_e0;
  MppBufSlots local_d8;
  pthread_mutex_t *local_d0;
  pthread_cond_t *local_c8;
  sem_t *local_c0;
  MppThread *local_b8;
  HalTaskInfo local_b0;
  
  ctx = *(MppDec *)((long)data + 0xa8);
  this = *(MppThread **)((long)ctx + 0x28);
  local_e0 = *(MppBufSlots *)((long)ctx + 0x30);
  pvVar4 = *(HalTaskGroup *)((long)ctx + 0x78);
  local_d8 = *(MppBufSlots *)((long)ctx + 0x38);
  local_100 = (HalTaskHnd)0x0;
  mpp_clock_start(*(MppClock *)((long)ctx + 0x260));
  __mutex = (pthread_mutex_t *)this->mMutexCond;
  pthread_mutex_lock(__mutex);
  MVar2 = MppThread::get_status(this,THREAD_WORK);
  if (MVar2 == MPP_THREAD_RUNNING) {
    local_c0 = (sem_t *)((long)ctx + 0x1d8);
    local_c8 = (pthread_cond_t *)&this->mMutexCond[0].mCondition;
    local_e8 = pvVar4;
    local_d0 = __mutex;
    local_b8 = this;
    do {
      MVar3 = hal_task_get_hnd(pvVar4,1,&local_100);
      if (MVar3 == MPP_OK) {
        pthread_mutex_unlock(__mutex);
        if (local_100 != (HalTaskHnd)0x0) {
          mpp_clock_start(*(MppClock *)((long)ctx + 0x270));
          *(int *)((long)data + 0x34) = *(int *)((long)data + 0x34) + 1;
          hal_task_hnd_get_info(local_100,&local_b0);
          if (((ulong)local_b0.dec.flags & 2) == 0) {
            if ((((ulong)local_b0.dec.flags & 1) == 0) ||
               ((local_b0.dec.valid != 0 && (-1 < local_b0.dec.output)))) {
              mpp_clock_start(*(MppClock *)((long)ctx + 0x278));
              mpp_hal_hw_wait(*(MppHal *)((long)ctx + 0x18),&local_b0);
              mpp_clock_pause(*(MppClock *)((long)ctx + 0x278));
              *(int *)((long)ctx + 0x284) = *(int *)((long)ctx + 0x284) + 1;
              mpp_buf_slot_clr_flag(local_d8,local_b0.dec.input,SLOT_HAL_INPUT);
              hal_task_hnd_set_status(local_100,(uint)(*(int *)((long)ctx + 0x1f8) == 0) * 2);
              iVar1 = *(int *)((long)ctx + 0x1f8);
              local_100 = (HalTaskHnd)0x0;
              if (-1 < local_b0.dec.output) {
                mpp_buf_slot_clr_flag(local_e0,local_b0.dec.output,SLOT_HAL_OUTPUT);
              }
              lVar5 = 0xe;
              do {
                index_00 = *(RK_S32 *)((long)&local_b0 + lVar5 * 4);
                if (-1 < index_00) {
                  mpp_buf_slot_clr_flag(local_e0,index_00,SLOT_HAL_INPUT);
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 != 0x1f);
              if (((ulong)local_b0.dec.flags & 1) != 0) {
                mpp_dec_flush(ctx);
              }
              mpp_dec_push_display((Mpp *)data,local_b0.dec.flags);
              mpp_dec_notify(ctx,(uint)(iVar1 == 0) << 9 | 0x100);
              mpp_clock_pause(*(MppClock *)((long)ctx + 0x270));
              pvVar4 = local_e8;
              goto LAB_00147f48;
            }
            mpp_dec_push_display((Mpp *)data,local_b0.dec.flags);
            index_01 = -1;
          }
          else {
            mpp_dec_flush(ctx);
            mpp_dec_push_display((Mpp *)data,local_b0.dec.flags);
            index_01 = local_b0.dec.output;
          }
          mpp_dec_put_frame((Mpp *)data,index_01,local_b0.dec.flags);
          hal_task_hnd_set_status(local_100,0);
          local_100 = (HalTaskHnd)0x0;
          mpp_dec_notify(ctx,0x100);
          mpp_clock_pause(*(MppClock *)((long)ctx + 0x270));
        }
      }
      else {
        if (*(int *)((long)ctx + 0x1ac) == *(int *)((long)ctx + 0x1b0)) {
          mpp_dec_notify(ctx,0x80);
          mpp_clock_start(*(MppClock *)((long)ctx + 0x268));
          MVar2 = this->mStatus[0];
          this->mStatus[0] = MPP_THREAD_WAITING;
          pthread_cond_wait(local_c8,__mutex);
          if (this->mStatus[0] == MPP_THREAD_WAITING) {
            this->mStatus[0] = MVar2;
          }
          mpp_clock_pause(*(MppClock *)((long)ctx + 0x268));
        }
        else {
          if (((byte)mpp_dec_debug & 0x40) != 0) {
            _mpp_log_l(4,"mpp_dec","reset: hal reset start\n",(char *)0x0);
          }
          ctx_00 = *(MppDec *)((long)data + 0xa8);
          slots = *(MppBufSlots *)((long)ctx_00 + 0x30);
          pvVar4 = *(HalTaskGroup *)((long)ctx_00 + 0x78);
          local_f4 = -1;
          local_f0 = (HalTaskHnd)0x0;
          mpp_dec_flush(ctx_00);
          pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)ctx_00 + 0x28) + 0xb8));
          while (MVar3 = mpp_buf_slot_dequeue(slots,&local_f4,QUEUE_DISPLAY), MVar3 == MPP_OK) {
            mpp_dec_put_frame((Mpp *)data,local_f4,(HalDecTaskFlag)0x0);
            mpp_buf_slot_clr_flag(slots,local_f4,SLOT_QUEUE_USE);
          }
          MVar3 = hal_task_get_hnd(pvVar4,2,&local_f0);
          __mutex = local_d0;
          while (MVar3 == MPP_OK) {
            if (local_f0 != (HalTaskHnd)0x0) {
              hal_task_hnd_set_status(local_f0,0);
              local_f0 = (HalTaskHnd)0x0;
            }
            MVar3 = hal_task_get_hnd(pvVar4,2,&local_f0);
          }
          pthread_mutex_unlock((pthread_mutex_t *)(*(long *)((long)ctx_00 + 0x28) + 0xb8));
          if (((byte)mpp_dec_debug & 0x40) != 0) {
            _mpp_log_l(4,"mpp_dec","reset: hal reset done\n",(char *)0x0);
          }
          *(int *)((long)ctx + 0x1b0) = *(int *)((long)ctx + 0x1b0) + 1;
          sem_post(local_c0);
          pvVar4 = local_e8;
          this = local_b8;
        }
        pthread_mutex_unlock(__mutex);
      }
LAB_00147f48:
      pthread_mutex_lock(__mutex);
      MVar2 = MppThread::get_status(this,THREAD_WORK);
    } while (MVar2 == MPP_THREAD_RUNNING);
  }
  pthread_mutex_unlock(__mutex);
  mpp_clock_pause(*(MppClock *)((long)ctx + 0x260));
  if ((*(int *)((long)data + 0x30) != *(int *)((long)data + 0x34)) &&
     (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "mpp->mTaskPutCount == mpp->mTaskGetCount","mpp_dec_hal_thread",0x38d),
     (mpp_debug >> 0x1c & 1) != 0)) {
    abort();
  }
  if ((mpp_debug & 4) != 0) {
    _mpp_log_l(4,"mpp_dec","mpp_dec_hal_thread exited\n",(char *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void *mpp_dec_hal_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppThread *hal = dec->thread_hal;
    HalTaskGroup tasks = dec->tasks;
    MppBufSlots frame_slots = dec->frame_slots;
    MppBufSlots packet_slots = dec->packet_slots;

    HalTaskHnd  task = NULL;
    HalTaskInfo task_info;
    HalDecTask  *task_dec = &task_info.dec;

    mpp_clock_start(dec->clocks[DEC_HAL_TOTAL]);

    while (1) {
        /* hal thread wait for dxva interface intput first */
        {
            AutoMutex work_lock(hal->mutex());
            if (MPP_THREAD_RUNNING != hal->get_status())
                break;

            if (hal_task_get_hnd(tasks, TASK_PROCESSING, &task)) {
                // process all task then do reset process
                if (dec->hal_reset_post != dec->hal_reset_done) {
                    dec_dbg_reset("reset: hal reset start\n");
                    reset_hal_thread(mpp);
                    dec_dbg_reset("reset: hal reset done\n");
                    dec->hal_reset_done++;
                    sem_post(&dec->hal_reset);
                    continue;
                }

                mpp_dec_notify(dec, MPP_DEC_NOTIFY_TASK_ALL_DONE);
                mpp_clock_start(dec->clocks[DEC_HAL_WAIT]);
                hal->wait();
                mpp_clock_pause(dec->clocks[DEC_HAL_WAIT]);
                continue;
            }
        }

        if (task) {
            RK_U32 notify_flag = MPP_DEC_NOTIFY_TASK_HND_VALID;

            mpp_clock_start(dec->clocks[DEC_HAL_PROC]);
            mpp->mTaskGetCount++;

            hal_task_hnd_get_info(task, &task_info);

            /*
             * check info change flag
             * if this is a frame with that flag, only output an empty
             * MppFrame without any image data for info change.
             */
            if (task_dec->flags.info_change) {
                mpp_dec_flush(dec);
                mpp_dec_push_display(mpp, task_dec->flags);
                mpp_dec_put_frame(mpp, task_dec->output, task_dec->flags);

                hal_task_hnd_set_status(task, TASK_IDLE);
                task = NULL;
                mpp_dec_notify(dec, notify_flag);
                mpp_clock_pause(dec->clocks[DEC_HAL_PROC]);
                continue;
            }
            /*
             * check eos task
             * if this task is invalid while eos flag is set, we will
             * flush display queue then push the eos frame to info that
             * all frames have decoded.
             */
            if (task_dec->flags.eos &&
                (!task_dec->valid || task_dec->output < 0)) {
                mpp_dec_push_display(mpp, task_dec->flags);
                /*
                 * Use -1 as invalid buffer slot index.
                 * Reason: the last task maybe is a empty task with eos flag
                 * only but this task may go through vproc process also. We need
                 * create a buffer slot index for it.
                 */
                mpp_dec_put_frame(mpp, -1, task_dec->flags);

                hal_task_hnd_set_status(task, TASK_IDLE);
                task = NULL;
                mpp_dec_notify(dec, notify_flag);
                mpp_clock_pause(dec->clocks[DEC_HAL_PROC]);
                continue;
            }

            mpp_clock_start(dec->clocks[DEC_HW_WAIT]);
            mpp_hal_hw_wait(dec->hal, &task_info);
            mpp_clock_pause(dec->clocks[DEC_HW_WAIT]);
            dec->dec_hw_run_count++;

            /*
             * when hardware decoding is done:
             * 1. clear decoding flag (mark buffer is ready)
             * 2. use get_display to get a new frame with buffer
             * 3. add frame to output list
             * repeat 2 and 3 until not frame can be output
             */
            mpp_buf_slot_clr_flag(packet_slots, task_dec->input,
                                  SLOT_HAL_INPUT);

            hal_task_hnd_set_status(task, (dec->parser_fast_mode) ?
                                    (TASK_IDLE) : (TASK_PROC_DONE));

            if (dec->parser_fast_mode)
                notify_flag |= MPP_DEC_NOTIFY_TASK_HND_VALID;
            else
                notify_flag |= MPP_DEC_NOTIFY_TASK_PREV_DONE;

            task = NULL;

            if (task_dec->output >= 0)
                mpp_buf_slot_clr_flag(frame_slots, task_dec->output, SLOT_HAL_OUTPUT);

            for (RK_U32 i = 0; i < MPP_ARRAY_ELEMS(task_dec->refer); i++) {
                RK_S32 index = task_dec->refer[i];
                if (index >= 0)
                    mpp_buf_slot_clr_flag(frame_slots, index, SLOT_HAL_INPUT);
            }
            if (task_dec->flags.eos)
                mpp_dec_flush(dec);
            mpp_dec_push_display(mpp, task_dec->flags);

            mpp_dec_notify(dec, notify_flag);
            mpp_clock_pause(dec->clocks[DEC_HAL_PROC]);
        }
    }

    mpp_clock_pause(dec->clocks[DEC_HAL_TOTAL]);

    mpp_assert(mpp->mTaskPutCount == mpp->mTaskGetCount);
    mpp_dbg_info("mpp_dec_hal_thread exited\n");
    return NULL;
}